

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteVerilog.c
# Opt level: O0

int Io_WriteVerilogWiresCount(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_34;
  int local_30;
  int nWires;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_34 = Abc_NtkLatchNum(pNtk);
  nWires = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= nWires) {
      nWires = 0;
      do {
        iVar1 = Vec_PtrSize(pNtk->vBoxes);
        if (iVar1 <= nWires) {
          return local_34;
        }
        pAVar2 = Abc_NtkBox(pNtk,nWires);
        iVar1 = Abc_ObjIsLatch(pAVar2);
        if (iVar1 == 0) {
          iVar1 = Abc_ObjFaninNum(pAVar2);
          local_34 = iVar1 + local_34;
          for (local_30 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_30 < iVar1;
              local_30 = local_30 + 1) {
            pAVar3 = Abc_ObjFanout(pAVar2,local_30);
            pAVar3 = Abc_ObjFanout0(pAVar3);
            iVar1 = Abc_ObjFanoutNum(pAVar3);
            if (iVar1 < 1) {
LAB_003d1c59:
              local_34 = local_34 + 1;
            }
            else {
              pAVar3 = Abc_ObjFanout0(pAVar3);
              iVar1 = Abc_ObjIsCo(pAVar3);
              if (iVar1 == 0) goto LAB_003d1c59;
            }
          }
        }
        nWires = nWires + 1;
      } while( true );
    }
    pAVar2 = Abc_NtkObj(pNtk,nWires);
    if (((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) &&
       (nWires != 0)) {
      pAVar2 = Abc_ObjFanout0(pAVar2);
      iVar1 = Abc_ObjFanoutNum(pAVar2);
      if (0 < iVar1) {
        pAVar2 = Abc_ObjFanout0(pAVar2);
        iVar1 = Abc_ObjIsCo(pAVar2);
        if (iVar1 != 0) goto LAB_003d1b6b;
      }
      local_34 = local_34 + 1;
    }
LAB_003d1b6b:
    nWires = nWires + 1;
  } while( true );
}

Assistant:

int Io_WriteVerilogWiresCount( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pNet, * pBox;
    int i, k, nWires;
    nWires = Abc_NtkLatchNum(pNtk);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( i == 0 ) 
            continue;
        pNet = Abc_ObjFanout0(pObj);
        if ( Abc_ObjFanoutNum(pNet) > 0 && Abc_ObjIsCo(Abc_ObjFanout0(pNet)) )
            continue;
        nWires++;
    }
    Abc_NtkForEachBox( pNtk, pBox, i )
    {
        if ( Abc_ObjIsLatch(pBox) )
            continue;
        nWires += Abc_ObjFaninNum(pBox);
        Abc_ObjForEachFanout( pBox, pObj, k )
        {
            pNet = Abc_ObjFanout0(pObj);
            if ( Abc_ObjFanoutNum(pNet) > 0 && Abc_ObjIsCo(Abc_ObjFanout0(pNet)) )
                continue;
            nWires++;
        }
    }
    return nWires;
}